

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack21_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar13 [32];
  
  uVar2 = *in;
  auVar1 = *(undefined1 (*) [16])(in + 1);
  auVar9 = vpmovsxbd_avx2(ZEXT816(0x3020201000008));
  auVar12._8_4_ = 0x1fffff;
  auVar12._0_8_ = 0x1fffff001fffff;
  auVar12._12_4_ = 0x1fffff;
  auVar13._16_4_ = 0x1fffff;
  auVar13._0_16_ = auVar12;
  auVar13._20_4_ = 0x1fffff;
  auVar13._24_4_ = 0x1fffff;
  auVar13._28_4_ = 0x1fffff;
  uVar3 = in[10];
  *out = uVar2 & 0x1fffff;
  uVar4 = *(ulong *)(in + 5);
  auVar9 = vpermi2d_avx512vl(auVar9,ZEXT1632(auVar1),ZEXT432(uVar2));
  auVar1 = vpshufd_avx(auVar1,0x9c);
  auVar1 = vpsllvd_avx2(auVar1,_DAT_00191bd0);
  auVar1 = vpand_avx(auVar1,_DAT_00191be0);
  uVar14 = (undefined4)uVar4;
  auVar10._4_4_ = uVar14;
  auVar10._0_4_ = uVar14;
  auVar10._8_4_ = uVar14;
  auVar10._12_4_ = uVar14;
  auVar10._16_4_ = uVar14;
  auVar10._20_4_ = uVar14;
  auVar10._24_4_ = uVar14;
  auVar10._28_4_ = uVar14;
  auVar9 = vpblendd_avx2(auVar9,auVar10,0x80);
  auVar7 = vpsrlvd_avx2(auVar9,_DAT_0018ea20);
  auVar10 = vpbroadcastd_avx512vl();
  uVar5 = *(ulong *)(in + 7);
  auVar9 = vpermq_avx2(ZEXT1632(auVar1),0xc4);
  auVar9 = vpblendd_avx2(auVar9,auVar10,0x40);
  auVar1 = vpinsrd_avx(auVar12,((uint)(uVar4 >> 0x20) & 0x3ffff) << 3,0);
  uVar2 = in[9];
  auVar10 = vpor_avx2(auVar7,auVar9);
  auVar9 = vpand_avx2(auVar7,auVar13);
  auVar9 = vpblendd_avx2(auVar10,auVar9,0x92);
  *(undefined1 (*) [32])(out + 1) = auVar9;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar5;
  auVar15 = vpsllvd_avx2(auVar11,_DAT_0019dfb0);
  auVar6._8_8_ = 0x1ffff0001fc000;
  auVar6._0_8_ = 0x1ffff0001fc000;
  auVar8 = vpandq_avx512vl(auVar15,auVar6);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar4;
  auVar15 = vshufps_avx(auVar15,auVar11,4);
  auVar6 = vpsrlvd_avx2(auVar15,_DAT_0019dfd0);
  auVar1 = vpunpckldq_avx(auVar1,auVar8);
  auVar15 = vpor_avx(auVar6,auVar1);
  auVar1 = vpand_avx(auVar6,auVar12);
  auVar1 = vpblendd_avx2(auVar15,auVar1,4);
  *(undefined1 (*) [16])(out + 9) = auVar1;
  out[0xd] = (uint)(uVar5 >> 0x31) | (uVar2 & 0x3f) << 0xf;
  out[0xe] = uVar2 >> 6 & 0x1fffff;
  out[0xf] = (uVar3 & 0xffff) << 5 | uVar2 >> 0x1b;
  return in + 0xb;
}

Assistant:

const uint32_t *__fastunpack21_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 10)) << (21 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 21);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 20)) << (21 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 9)) << (21 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 21);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 19)) << (21 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 8)) << (21 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 21);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 18)) << (21 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 7)) << (21 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 21);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 17)) << (21 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 6)) << (21 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 21);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 16)) << (21 - 16);
  out++;

  return in + 1;
}